

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBcollider.cpp
# Opt level: O2

eCollSuccess __thiscall
chrono::collision::CHOBBcollider::ComputeCollisions
          (CHOBBcollider *this,ChMatrix33<double> *R1,Vector *T1,ChCollisionTree *oc1,
          ChMatrix33<double> *R2,Vector *T2,ChCollisionTree *oc2,eCollMode flag)

{
  ChMatrix33<double> *alignment;
  undefined1 auVar1 [16];
  eCollSuccess eVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> local_88;
  double local_78;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_70;
  Vector local_68;
  Vector local_48;
  
  dVar4 = GetTime();
  local_48.m_data[0] = T1->m_data[0];
  local_48.m_data[1] = T1->m_data[1];
  local_48.m_data[2] = T1->m_data[2];
  local_68.m_data[0] = T2->m_data[0];
  local_68.m_data[1] = T2->m_data[1];
  local_68.m_data[2] = T2->m_data[2];
  eVar2 = ChNarrowPhaseCollider::ComputeCollisions
                    (&this->super_ChNarrowPhaseCollider,R1,&local_48,oc1,R2,&local_68,oc2,flag);
  if (eVar2 == ChC_RESULT_OK) {
    (this->super_ChNarrowPhaseCollider).num_bv_tests = 0;
    (this->super_ChNarrowPhaseCollider).num_geo_tests = 0;
    if (ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
        ::Rtemp == '\0') {
      iVar3 = __cxa_guard_acquire(&ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
                                   ::Rtemp);
      if (iVar3 != 0) {
        __cxa_guard_release(&ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
                             ::Rtemp);
      }
    }
    if (ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
        ::bR == '\0') {
      iVar3 = __cxa_guard_acquire(&ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
                                   ::bR);
      if (iVar3 != 0) {
        __cxa_guard_release(&ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
                             ::bR);
      }
    }
    if (ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
        ::bT == '\0') {
      iVar3 = __cxa_guard_acquire(&ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
                                   ::bT);
      if (iVar3 != 0) {
        ComputeCollisions::bT.m_data[2] = 0.0;
        ComputeCollisions::bT.m_data[0] = 0.0;
        ComputeCollisions::bT.m_data[1] = 0.0;
        __cxa_guard_release(&ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
                             ::bT);
      }
    }
    if (ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
        ::Ttemp == '\0') {
      iVar3 = __cxa_guard_acquire(&ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
                                   ::Ttemp);
      if (iVar3 != 0) {
        ComputeCollisions::Ttemp.m_data[2] = 0.0;
        ComputeCollisions::Ttemp.m_data._0_16_ = ZEXT816(0);
        __cxa_guard_release(&ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
                             ::Ttemp);
      }
    }
    local_88.m_rhs = (RhsNested)oc2[1]._vptr_ChCollisionTree;
    alignment = &(this->super_ChNarrowPhaseCollider).R;
    local_88.m_lhs = &alignment->super_Matrix<double,_3,_3,_1,_3,_3>;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&ComputeCollisions::Rtemp.super_Matrix<double,_3,_3,_1,_3,_3>,&local_88);
    local_88.m_lhs = (LhsNested)oc1[1]._vptr_ChCollisionTree;
    local_88.m_rhs = &ComputeCollisions::Rtemp.super_Matrix<double,_3,_3,_1,_3,_3>;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&ComputeCollisions::bR.super_Matrix<double,_3,_3,_1,_3,_3>,&local_88);
    ChTransform<double>::TransformLocalToParent
              ((ChVector<double> *)(oc2[1]._vptr_ChCollisionTree + 9),
               &(this->super_ChNarrowPhaseCollider).T,alignment);
    local_70.m_matrix = (non_const_type)oc1[1]._vptr_ChCollisionTree;
    auVar1._8_8_ = local_88.m_rhs;
    auVar1._0_8_ = local_88.m_lhs;
    ComputeCollisions::Ttemp.m_data._0_16_ =
         vsubpd_avx(auVar1,*(undefined1 (*) [16])
                            local_70.m_matrix[1].
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array);
    ComputeCollisions::Ttemp.m_data[2] =
         local_78 -
         (double)local_70.m_matrix[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                 m_storage.m_data.array[2];
    chrono::operator*(&local_70,&ComputeCollisions::Ttemp);
    ComputeCollisions::bT.m_data[0] = (double)local_88.m_lhs;
    ComputeCollisions::bT.m_data[1] = (double)local_88.m_rhs;
    ComputeCollisions::bT.m_data[2] = local_78;
    CollideRecurse(this,&ComputeCollisions::bR,&ComputeCollisions::bT,(CHOBBTree *)oc1,0,
                   (CHOBBTree *)oc2,0,flag);
    dVar5 = GetTime();
    (this->super_ChNarrowPhaseCollider).query_time_secs = dVar5 - dVar4;
    eVar2 = ChC_RESULT_OK;
  }
  else {
    eVar2 = ChC_RESULT_GENERICERROR;
  }
  return eVar2;
}

Assistant:

ChNarrowPhaseCollider::eCollSuccess CHOBBcollider::ComputeCollisions(ChMatrix33<>& R1,
                                                                     Vector T1,
                                                                     ChCollisionTree* oc1,
                                                                     ChMatrix33<>& R2,
                                                                     Vector T2,
                                                                     ChCollisionTree* oc2,
                                                                     eCollMode flag) {
    double t1 = GetTime();

    // INHERIT parent class behavior

    if (ChNarrowPhaseCollider::ComputeCollisions(R1, T1, oc1, R2, T2, oc2, flag) != ChC_RESULT_OK)
        return ChC_RESULT_GENERICERROR;

    // Downcasting
    CHOBBTree* o1 = (CHOBBTree*)oc1;
    CHOBBTree* o2 = (CHOBBTree*)oc2;

    // clear the stats

    this->num_bv_tests = 0;
    this->num_geo_tests = 0;

    // compute the transform from o1->child(0) to o2->child(0)

    static ChMatrix33<> Rtemp;
    static ChMatrix33<> bR;
    static Vector bT;
    static Vector Ttemp;

    Rtemp = this->R * o2->child(0)->Rot;  // MxM(Rtemp,this->R,o2->child(0)->R);
    bR = o1->child(0)->Rot * Rtemp;       // MTxM(R,o1->child(0)->R,Rtemp);

    Ttemp = ChTransform<>::TransformLocalToParent(o2->child(0)->To, this->T,
                                                  this->R);  // MxVpV(Ttemp,this->R,o2->child(0)->To,this->T);
    Ttemp = Vsub(Ttemp, o1->child(0)->To);                   // VmV(Ttemp,Ttemp,o1->child(0)->To);

    bT = o1->child(0)->Rot.transpose() * Ttemp;  // MTxV(T,o1->child(0)->R,Ttemp);

    // now start with both top level BVs

    CollideRecurse(bR, bT, o1, 0, o2, 0, flag);

    double t2 = GetTime();
    this->query_time_secs = t2 - t1;

    return ChC_RESULT_OK;
}